

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void nlohmann::detail::
     serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::throw_if_invalid_utf8(string *str)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  type_error *ptVar5;
  size_type *psVar6;
  byte bVar7;
  unsigned_long __val;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [50];
  char acStack_b8 [152];
  
  if (str->_M_string_length != 0) {
    __val = 0;
    bVar7 = 0;
    do {
      bVar2 = (str->_M_dataplus)._M_p[__val];
      bVar7 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ::decode(unsigned_char&,unsigned_char)::utf8d
              [(ulong)bVar7 * 0x10 +
               (ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                            ::decode(unsigned_char&,unsigned_char)::utf8d[bVar2] + 0x100];
      if (bVar7 == 1) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
        puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        lVar3 = *(long *)(local_198[0] + -0x18);
        if (acStack_b8[lVar3 + 1] == '\0') {
          std::ios::widen((char)&local_248 + (char)lVar3 + -0x50);
          acStack_b8[lVar3 + 1] = '\x01';
        }
        acStack_b8[lVar3] = '0';
        *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
             *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_198,(uint)bVar2);
        ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string(&local_208,__val);
        std::operator+(&local_1c8,"invalid UTF-8 byte at index ",&local_208);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_248._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_248._M_dataplus._M_p == psVar6) {
          local_248.field_2._M_allocated_capacity = *psVar6;
          local_248.field_2._8_8_ = plVar4[3];
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar6;
        }
        local_248._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::stringbuf::str();
        std::operator+(&local_228,&local_248,&local_1e8);
        type_error::create(ptVar5,0x13c,&local_228);
        __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
      }
      __val = __val + 1;
    } while (str->_M_string_length != __val);
    if (bVar7 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      lVar3 = *(long *)(local_198[0] + -0x18);
      if (acStack_b8[lVar3 + 1] == '\0') {
        std::ios::widen((char)&local_248 + (char)lVar3 + -0x50);
        acStack_b8[lVar3 + 1] = '\x01';
      }
      acStack_b8[lVar3] = '0';
      *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<
                ((ostream *)local_198,(uint)(byte)(str->_M_dataplus)._M_p[str->_M_string_length - 1]
                );
      ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_228,"incomplete UTF-8 string; last byte: 0x",&local_248);
      type_error::create(ptVar5,0x13c,&local_228);
      __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
    }
  }
  return;
}

Assistant:

static void throw_if_invalid_utf8(const std::string& str)
    {
        // start with state 0 (= accept)
        uint8_t state = 0;

        for (size_t i = 0; i < str.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(str[i]);
            decode(state, byte);
            if (state == 1)
            {
                // state 1 means reject
                std::stringstream ss;
                ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
                JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
            }
        }

        if (state != 0)
        {
            // we finish reading, but do not accept: string was incomplete
            std::stringstream ss;
            ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(str.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
        }
    }